

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O2

int schemasTest(char *filename,char *resul,char *errr,int options)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  undefined8 uVar5;
  long lVar6;
  size_t sVar7;
  char *pcVar8;
  long lVar9;
  FILE *__stream;
  char *__format;
  ulong uVar10;
  bool bVar11;
  int local_89c;
  glob_t globbuf;
  char prefix [500];
  char result [500];
  char err [500];
  char pattern [500];
  
  pcVar4 = baseFilename(filename);
  uVar5 = xmlSchemaNewParserCtxt(filename);
  xmlSchemaSetParserErrors(uVar5,testErrorHandler,testErrorHandler,uVar5);
  lVar6 = xmlSchemaParse(uVar5);
  xmlSchemaFreeParserCtxt(uVar5);
  sVar7 = strlen(pcVar4);
  iVar2 = (int)sVar7;
  if (iVar2 - 500U < 0xfffffe11) {
    xmlSchemaFree(lVar6);
    local_89c = -1;
  }
  else {
    iVar3 = iVar2 + -6;
    if (pcVar4[(long)iVar2 + -6] != '_') {
      iVar3 = iVar2 + -4;
    }
    if (pcVar4[(long)iVar3 + -2] == '_') {
      iVar3 = iVar3 + -2;
    }
    sVar7 = (size_t)iVar3;
    memcpy(prefix,pcVar4,sVar7);
    prefix[sVar7] = '\0';
    iVar2 = snprintf(pattern,499,"./test/schemas/%s_?.xml",prefix);
    if (0x1f2 < iVar2) {
      pattern[499] = '\0';
    }
    if (pcVar4[sVar7] == '_') {
      memcpy(prefix,pcVar4,sVar7 + 2);
      prefix[sVar7 + 2] = '\0';
    }
    globbuf.gl_offs = 0;
    glob64(pattern,8,(__errfunc *)0x0,(glob64_t *)&globbuf);
    local_89c = 0;
    for (uVar10 = 0; uVar10 < globbuf.gl_pathc; uVar10 = uVar10 + 1) {
      testErrorsSize = 0;
      testErrors[0] = '\0';
      pcVar4 = globbuf.gl_pathv[uVar10];
      pcVar8 = baseFilename(pcVar4);
      sVar7 = strlen(pcVar8);
      iVar2 = (int)sVar7;
      if ((iVar2 < 7) || (pcVar8[iVar2 - 6] != '_')) {
        fprintf(_stderr,"don\'t know how to process %s\n",pcVar4);
      }
      else {
        cVar1 = pcVar8[iVar2 - 5];
        iVar2 = snprintf(result,499,"result/schemas/%s_%c",prefix,(ulong)(uint)(int)cVar1);
        if (0x1f2 < iVar2) {
          result[499] = '\0';
        }
        iVar2 = snprintf(err,499,"result/schemas/%s_%c.err",prefix,(ulong)(uint)(int)cVar1);
        if (0x1f2 < iVar2) {
          err[499] = '\0';
        }
        if (lVar6 != 0) {
          nb_tests = nb_tests + 1;
          lVar9 = xmlReadFile(pcVar4,0,options);
          if (lVar9 == 0) {
            fprintf(_stderr,"failed to parse instance %s for %s\n",pcVar4,filename);
          }
          else {
            pcVar8 = resultFilename(result,temp_directory,".res");
            if (pcVar8 == (char *)0x0) {
              fwrite("Out of memory\n",0xe,1,_stderr);
              fatalError();
            }
            __stream = fopen64(pcVar8,"wb");
            if (__stream != (FILE *)0x0) {
              uVar5 = xmlSchemaNewValidCtxt(lVar6);
              xmlSchemaSetValidErrors(uVar5,testErrorHandler,testErrorHandler,uVar5);
              iVar2 = xmlSchemaValidateDoc(uVar5,lVar9);
              __format = "%s validation generated an internal error\n";
              if (0 < iVar2) {
                __format = "%s fails to validate\n";
              }
              if (iVar2 == 0) {
                __format = "%s validates\n";
              }
              fprintf(__stream,__format,pcVar4);
              fclose(__stream);
              iVar3 = compareFiles(pcVar8,result);
              bVar11 = iVar3 != 0;
              if (bVar11) {
                fprintf(_stderr,"Result for %s on %s failed\n",pcVar4,filename);
              }
              unlink(pcVar8);
              free(pcVar8);
              if ((iVar2 != 0) &&
                 (iVar2 = compareFileMem(err,testErrors,testErrorsSize), iVar2 != 0)) {
                fprintf(_stderr,"Error for %s on %s failed\n",pcVar4,filename);
                bVar11 = true;
              }
              xmlSchemaFreeValidCtxt(uVar5);
              xmlFreeDoc(lVar9);
              if (bVar11) {
                local_89c = 1;
              }
              goto LAB_0010782d;
            }
            fprintf(_stderr,"failed to open output file %s\n",pcVar8);
            xmlFreeDoc(lVar9);
            free(pcVar8);
          }
          local_89c = -1;
        }
      }
LAB_0010782d:
    }
    globfree64((glob64_t *)&globbuf);
    xmlSchemaFree(lVar6);
  }
  return local_89c;
}

Assistant:

static int
schemasTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *errr ATTRIBUTE_UNUSED,
            int options) {
    const char *base = baseFilename(filename);
    const char *base2;
    const char *instance;
    xmlSchemaParserCtxtPtr ctxt;
    xmlSchemaPtr schemas;
    int res = 0, len, ret;
    char pattern[500];
    char prefix[500];
    char result[500];
    char err[500];
    glob_t globbuf;
    size_t i;
    char count = 0;

    /* first compile the schemas if possible */
    ctxt = xmlSchemaNewParserCtxt(filename);
    xmlSchemaSetParserErrors(ctxt, testErrorHandler, testErrorHandler, ctxt);
    schemas = xmlSchemaParse(ctxt);
    xmlSchemaFreeParserCtxt(ctxt);

    /*
     * most of the mess is about the output filenames generated by the Makefile
     */
    len = strlen(base);
    if ((len > 499) || (len < 5)) {
        xmlSchemaFree(schemas);
	return(-1);
    }
    len -= 4; /* remove trailing .xsd */
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    if (base[len - 2] == '_') {
        len -= 2; /* remove subtest number */
    }
    memcpy(prefix, base, len);
    prefix[len] = 0;

    if (snprintf(pattern, 499, "./test/schemas/%s_?.xml", prefix) >= 499)
        pattern[499] = 0;

    if (base[len] == '_') {
        len += 2;
	memcpy(prefix, base, len);
	prefix[len] = 0;
    }

    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        testErrorsSize = 0;
	testErrors[0] = 0;
        instance = globbuf.gl_pathv[i];
	base2 = baseFilename(instance);
	len = strlen(base2);
	if ((len > 6) && (base2[len - 6] == '_')) {
	    count = base2[len - 5];
	    ret = snprintf(result, 499, "result/schemas/%s_%c",
		     prefix, count);
            if (ret >= 499)
	        result[499] = 0;
	    ret = snprintf(err, 499, "result/schemas/%s_%c.err",
		     prefix, count);
            if (ret >= 499)
	        err[499] = 0;
	} else {
	    fprintf(stderr, "don't know how to process %s\n", instance);
	    continue;
	}
	if (schemas == NULL) {
	} else {
	    nb_tests++;
	    ret = schemasOneTest(filename, instance, result, err,
	                         options, schemas);
	    if (ret != 0)
		res = ret;
	}
    }
    globfree(&globbuf);
    xmlSchemaFree(schemas);

    return(res);
}